

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Ref<embree::Geometry> *pRVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 (*pauVar32) [16];
  byte bVar33;
  int iVar34;
  undefined4 uVar35;
  ulong uVar37;
  undefined1 (*pauVar38) [16];
  long lVar39;
  ulong uVar40;
  ulong uVar41;
  size_t i;
  long lVar42;
  uint uVar43;
  long lVar44;
  ulong uVar45;
  ulong uVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  vint4 bi;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar68;
  float fVar75;
  float fVar76;
  vint4 ai;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar77;
  undefined1 auVar73 [16];
  float fVar78;
  undefined1 auVar74 [16];
  float fVar79;
  float fVar83;
  float fVar84;
  float fVar85;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar90;
  float fVar94;
  float fVar95;
  vint4 bi_1;
  float fVar96;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [64];
  uint uVar100;
  uint uVar101;
  undefined1 auVar97 [16];
  uint uVar102;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar103 [16];
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined1 local_10a8 [7] [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined1 local_fe8 [16];
  float local_fd8 [4];
  float local_fc8 [4];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined8 local_f98;
  undefined8 uStack_f90;
  undefined8 local_f88;
  undefined8 uStack_f80;
  size_t local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  vbool<4> valid;
  ulong uVar36;
  
  pauVar38 = (undefined1 (*) [16])local_f68;
  local_f78 = root.ptr;
  uStack_f70 = 0;
  uVar35 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar47._4_4_ = uVar35;
  auVar47._0_4_ = uVar35;
  auVar47._8_4_ = uVar35;
  auVar47._12_4_ = uVar35;
  uVar35 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar48._4_4_ = uVar35;
  auVar48._0_4_ = uVar35;
  auVar48._8_4_ = uVar35;
  auVar48._12_4_ = uVar35;
  uVar35 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar49._4_4_ = uVar35;
  auVar49._0_4_ = uVar35;
  auVar49._8_4_ = uVar35;
  auVar49._12_4_ = uVar35;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar37 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar40 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar34 = (tray->tfar).field_0.i[k];
  auVar93 = ZEXT1664(CONCAT412(iVar34,CONCAT48(iVar34,CONCAT44(iVar34,iVar34))));
  iVar34 = (tray->tnear).field_0.i[k];
  auVar50._4_4_ = iVar34;
  auVar50._0_4_ = iVar34;
  auVar50._8_4_ = iVar34;
  auVar50._12_4_ = iVar34;
LAB_00edc778:
  do {
    do {
      if (pauVar38 == (undefined1 (*) [16])&local_f78) {
        return;
      }
      pauVar32 = pauVar38 + -1;
      pauVar38 = pauVar38 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar32 + 8));
    uVar45 = *(ulong *)*pauVar38;
    while ((uVar45 & 8) == 0) {
      auVar52 = vsubps_avx(*(undefined1 (*) [16])(uVar45 + 0x20 + uVar37),auVar47);
      auVar51._0_4_ = fVar2 * auVar52._0_4_;
      auVar51._4_4_ = fVar2 * auVar52._4_4_;
      auVar51._8_4_ = fVar2 * auVar52._8_4_;
      auVar51._12_4_ = fVar2 * auVar52._12_4_;
      auVar52 = vsubps_avx(*(undefined1 (*) [16])(uVar45 + 0x20 + uVar40),auVar48);
      auVar58._0_4_ = auVar52._0_4_ * fVar3;
      auVar58._4_4_ = auVar52._4_4_ * fVar3;
      auVar58._8_4_ = auVar52._8_4_ * fVar3;
      auVar58._12_4_ = auVar52._12_4_ * fVar3;
      auVar52 = vpmaxsd_avx(auVar51,auVar58);
      auVar51 = vsubps_avx(*(undefined1 (*) [16])(uVar45 + 0x20 + uVar41),auVar49);
      auVar59._0_4_ = auVar51._0_4_ * fVar4;
      auVar59._4_4_ = auVar51._4_4_ * fVar4;
      auVar59._8_4_ = auVar51._8_4_ * fVar4;
      auVar59._12_4_ = auVar51._12_4_ * fVar4;
      auVar51 = vpmaxsd_avx(auVar59,auVar50);
      local_1038 = vpmaxsd_avx(auVar52,auVar51);
      auVar52 = vsubps_avx(*(undefined1 (*) [16])(uVar45 + 0x20 + (uVar37 ^ 0x10)),auVar47);
      auVar60._0_4_ = auVar52._0_4_ * fVar2;
      auVar60._4_4_ = auVar52._4_4_ * fVar2;
      auVar60._8_4_ = auVar52._8_4_ * fVar2;
      auVar60._12_4_ = auVar52._12_4_ * fVar2;
      auVar52 = vsubps_avx(*(undefined1 (*) [16])(uVar45 + 0x20 + (uVar40 ^ 0x10)),auVar48);
      auVar69._0_4_ = auVar52._0_4_ * fVar3;
      auVar69._4_4_ = auVar52._4_4_ * fVar3;
      auVar69._8_4_ = auVar52._8_4_ * fVar3;
      auVar69._12_4_ = auVar52._12_4_ * fVar3;
      auVar52 = vpminsd_avx(auVar60,auVar69);
      auVar51 = vsubps_avx(*(undefined1 (*) [16])(uVar45 + 0x20 + (uVar41 ^ 0x10)),auVar49);
      auVar70._0_4_ = auVar51._0_4_ * fVar4;
      auVar70._4_4_ = auVar51._4_4_ * fVar4;
      auVar70._8_4_ = auVar51._8_4_ * fVar4;
      auVar70._12_4_ = auVar51._12_4_ * fVar4;
      auVar51 = vpminsd_avx(auVar70,auVar93._0_16_);
      auVar52 = vpminsd_avx(auVar52,auVar51);
      auVar52 = vpcmpgtd_avx(local_1038,auVar52);
      iVar34 = vmovmskps_avx(auVar52);
      if (iVar34 == 0xf) goto LAB_00edc778;
      bVar33 = (byte)iVar34 ^ 0xf;
      uVar46 = uVar45 & 0xfffffffffffffff0;
      lVar42 = 0;
      if (bVar33 != 0) {
        for (; (bVar33 >> lVar42 & 1) == 0; lVar42 = lVar42 + 1) {
        }
      }
      uVar45 = *(ulong *)(uVar46 + lVar42 * 8);
      uVar43 = bVar33 - 1 & (uint)bVar33;
      if (uVar43 != 0) {
        uVar100 = *(uint *)(local_1038 + lVar42 * 4);
        lVar42 = 0;
        if (uVar43 != 0) {
          for (; (uVar43 >> lVar42 & 1) == 0; lVar42 = lVar42 + 1) {
          }
        }
        uVar36 = *(ulong *)(uVar46 + lVar42 * 8);
        uVar101 = *(uint *)(local_1038 + lVar42 * 4);
        uVar43 = uVar43 - 1 & uVar43;
        if (uVar43 == 0) {
          if (uVar100 < uVar101) {
            *(ulong *)*pauVar38 = uVar36;
            *(uint *)(*pauVar38 + 8) = uVar101;
            pauVar38 = pauVar38 + 1;
          }
          else {
            *(ulong *)*pauVar38 = uVar45;
            *(uint *)(*pauVar38 + 8) = uVar100;
            pauVar38 = pauVar38 + 1;
            uVar45 = uVar36;
          }
        }
        else {
          auVar52._8_8_ = 0;
          auVar52._0_8_ = uVar45;
          auVar52 = vpunpcklqdq_avx(auVar52,ZEXT416(uVar100));
          auVar61._8_8_ = 0;
          auVar61._0_8_ = uVar36;
          auVar51 = vpunpcklqdq_avx(auVar61,ZEXT416(uVar101));
          lVar42 = 0;
          if (uVar43 != 0) {
            for (; (uVar43 >> lVar42 & 1) == 0; lVar42 = lVar42 + 1) {
            }
          }
          auVar71._8_8_ = 0;
          auVar71._0_8_ = *(ulong *)(uVar46 + lVar42 * 8);
          auVar59 = vpunpcklqdq_avx(auVar71,ZEXT416(*(uint *)(local_1038 + lVar42 * 4)));
          auVar58 = vpcmpgtd_avx(auVar51,auVar52);
          uVar43 = uVar43 - 1 & uVar43;
          if (uVar43 == 0) {
            auVar60 = vpshufd_avx(auVar58,0xaa);
            auVar58 = vblendvps_avx(auVar51,auVar52,auVar60);
            auVar52 = vblendvps_avx(auVar52,auVar51,auVar60);
            auVar51 = vpcmpgtd_avx(auVar59,auVar58);
            auVar60 = vpshufd_avx(auVar51,0xaa);
            auVar51 = vblendvps_avx(auVar59,auVar58,auVar60);
            auVar58 = vblendvps_avx(auVar58,auVar59,auVar60);
            auVar59 = vpcmpgtd_avx(auVar58,auVar52);
            auVar60 = vpshufd_avx(auVar59,0xaa);
            auVar59 = vblendvps_avx(auVar58,auVar52,auVar60);
            auVar52 = vblendvps_avx(auVar52,auVar58,auVar60);
            *pauVar38 = auVar52;
            pauVar38[1] = auVar59;
            uVar45 = auVar51._0_8_;
            pauVar38 = pauVar38 + 2;
          }
          else {
            lVar42 = 0;
            if (uVar43 != 0) {
              for (; (uVar43 >> lVar42 & 1) == 0; lVar42 = lVar42 + 1) {
              }
            }
            auVar86._8_8_ = 0;
            auVar86._0_8_ = *(ulong *)(uVar46 + lVar42 * 8);
            auVar69 = vpunpcklqdq_avx(auVar86,ZEXT416(*(uint *)(local_1038 + lVar42 * 4)));
            auVar60 = vpshufd_avx(auVar58,0xaa);
            auVar58 = vblendvps_avx(auVar51,auVar52,auVar60);
            auVar52 = vblendvps_avx(auVar52,auVar51,auVar60);
            auVar51 = vpcmpgtd_avx(auVar69,auVar59);
            auVar60 = vpshufd_avx(auVar51,0xaa);
            auVar51 = vblendvps_avx(auVar69,auVar59,auVar60);
            auVar59 = vblendvps_avx(auVar59,auVar69,auVar60);
            auVar60 = vpcmpgtd_avx(auVar59,auVar52);
            auVar69 = vpshufd_avx(auVar60,0xaa);
            auVar60 = vblendvps_avx(auVar59,auVar52,auVar69);
            auVar52 = vblendvps_avx(auVar52,auVar59,auVar69);
            auVar59 = vpcmpgtd_avx(auVar51,auVar58);
            auVar69 = vpshufd_avx(auVar59,0xaa);
            auVar59 = vblendvps_avx(auVar51,auVar58,auVar69);
            auVar51 = vblendvps_avx(auVar58,auVar51,auVar69);
            auVar58 = vpcmpgtd_avx(auVar60,auVar51);
            auVar69 = vpshufd_avx(auVar58,0xaa);
            auVar58 = vblendvps_avx(auVar60,auVar51,auVar69);
            auVar51 = vblendvps_avx(auVar51,auVar60,auVar69);
            *pauVar38 = auVar52;
            pauVar38[1] = auVar51;
            pauVar38[2] = auVar58;
            uVar45 = auVar59._0_8_;
            pauVar38 = pauVar38 + 3;
          }
        }
      }
    }
    uVar46 = uVar45 & 0xfffffffffffffff0;
    for (lVar42 = 0; lVar42 != (ulong)((uint)uVar45 & 0xf) - 8; lVar42 = lVar42 + 1) {
      lVar39 = lVar42 * 0xb0;
      pfVar1 = (float *)(uVar46 + 0x80 + lVar39);
      fVar8 = *pfVar1;
      fVar9 = pfVar1[1];
      fVar10 = pfVar1[2];
      fVar11 = pfVar1[3];
      pfVar1 = (float *)(uVar46 + 0x40 + lVar39);
      fVar12 = *pfVar1;
      fVar13 = pfVar1[1];
      fVar14 = pfVar1[2];
      fVar15 = pfVar1[3];
      auVar97._0_4_ = fVar8 * fVar12;
      auVar97._4_4_ = fVar9 * fVar13;
      auVar97._8_4_ = fVar10 * fVar14;
      auVar97._12_4_ = fVar11 * fVar15;
      pfVar1 = (float *)(uVar46 + 0x70 + lVar39);
      fVar16 = *pfVar1;
      fVar17 = pfVar1[1];
      fVar18 = pfVar1[2];
      fVar19 = pfVar1[3];
      pfVar1 = (float *)(uVar46 + 0x50 + lVar39);
      fVar20 = *pfVar1;
      fVar21 = pfVar1[1];
      fVar22 = pfVar1[2];
      fVar23 = pfVar1[3];
      auVar87._0_4_ = fVar16 * fVar20;
      auVar87._4_4_ = fVar17 * fVar21;
      auVar87._8_4_ = fVar18 * fVar22;
      auVar87._12_4_ = fVar19 * fVar23;
      local_fa8 = vsubps_avx(auVar87,auVar97);
      pfVar1 = (float *)(uVar46 + 0x60 + lVar39);
      fVar24 = *pfVar1;
      fVar25 = pfVar1[1];
      fVar26 = pfVar1[2];
      fVar27 = pfVar1[3];
      auVar103._0_4_ = fVar24 * fVar20;
      auVar103._4_4_ = fVar25 * fVar21;
      auVar103._8_4_ = fVar26 * fVar22;
      auVar103._12_4_ = fVar27 * fVar23;
      pfVar1 = (float *)(uVar46 + 0x30 + lVar39);
      fVar28 = *pfVar1;
      fVar29 = pfVar1[1];
      fVar30 = pfVar1[2];
      fVar31 = pfVar1[3];
      auVar53._0_4_ = fVar8 * fVar28;
      auVar53._4_4_ = fVar9 * fVar29;
      auVar53._8_4_ = fVar10 * fVar30;
      auVar53._12_4_ = fVar11 * fVar31;
      auVar58 = vsubps_avx(auVar53,auVar103);
      auVar54._0_4_ = fVar16 * fVar28;
      auVar54._4_4_ = fVar17 * fVar29;
      auVar54._8_4_ = fVar18 * fVar30;
      auVar54._12_4_ = fVar19 * fVar31;
      auVar62._0_4_ = fVar12 * fVar24;
      auVar62._4_4_ = fVar13 * fVar25;
      auVar62._8_4_ = fVar14 * fVar26;
      auVar62._12_4_ = fVar15 * fVar27;
      auVar59 = vsubps_avx(auVar62,auVar54);
      uVar35 = *(undefined4 *)(ray + k * 4);
      auVar55._4_4_ = uVar35;
      auVar55._0_4_ = uVar35;
      auVar55._8_4_ = uVar35;
      auVar55._12_4_ = uVar35;
      auVar52 = vsubps_avx(*(undefined1 (*) [16])(uVar46 + lVar39),auVar55);
      uVar35 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar56._4_4_ = uVar35;
      auVar56._0_4_ = uVar35;
      auVar56._8_4_ = uVar35;
      auVar56._12_4_ = uVar35;
      auVar51 = vsubps_avx(*(undefined1 (*) [16])(uVar46 + 0x10 + lVar39),auVar56);
      uVar35 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar57._4_4_ = uVar35;
      auVar57._0_4_ = uVar35;
      auVar57._8_4_ = uVar35;
      auVar57._12_4_ = uVar35;
      auVar60 = vsubps_avx(*(undefined1 (*) [16])(uVar46 + 0x20 + lVar39),auVar57);
      fVar68 = *(float *)(ray + k * 4 + 0x50);
      fVar75 = *(float *)(ray + k * 4 + 0x60);
      fVar79 = auVar60._0_4_;
      auVar88._0_4_ = fVar79 * fVar68;
      fVar83 = auVar60._4_4_;
      auVar88._4_4_ = fVar83 * fVar68;
      fVar84 = auVar60._8_4_;
      auVar88._8_4_ = fVar84 * fVar68;
      fVar85 = auVar60._12_4_;
      auVar88._12_4_ = fVar85 * fVar68;
      fVar78 = auVar51._0_4_;
      auVar63._0_4_ = fVar75 * fVar78;
      fVar77 = auVar51._4_4_;
      auVar63._4_4_ = fVar75 * fVar77;
      fVar6 = auVar51._8_4_;
      auVar63._8_4_ = fVar75 * fVar6;
      fVar7 = auVar51._12_4_;
      auVar63._12_4_ = fVar75 * fVar7;
      auVar51 = vsubps_avx(auVar63,auVar88);
      fVar76 = *(float *)(ray + k * 4 + 0x40);
      fVar90 = auVar52._0_4_;
      auVar64._0_4_ = fVar90 * fVar75;
      fVar94 = auVar52._4_4_;
      auVar64._4_4_ = fVar94 * fVar75;
      fVar95 = auVar52._8_4_;
      auVar64._8_4_ = fVar95 * fVar75;
      fVar96 = auVar52._12_4_;
      auVar64._12_4_ = fVar96 * fVar75;
      auVar80._0_4_ = fVar76 * fVar79;
      auVar80._4_4_ = fVar76 * fVar83;
      auVar80._8_4_ = fVar76 * fVar84;
      auVar80._12_4_ = fVar76 * fVar85;
      auVar60 = vsubps_avx(auVar80,auVar64);
      auVar81._0_4_ = fVar76 * fVar78;
      auVar81._4_4_ = fVar76 * fVar77;
      auVar81._8_4_ = fVar76 * fVar6;
      auVar81._12_4_ = fVar76 * fVar7;
      auVar91._0_4_ = fVar90 * fVar68;
      auVar91._4_4_ = fVar94 * fVar68;
      auVar91._8_4_ = fVar95 * fVar68;
      auVar91._12_4_ = fVar96 * fVar68;
      auVar69 = vsubps_avx(auVar91,auVar81);
      auVar89._0_4_ = local_fa8._0_4_ * fVar76 + auVar59._0_4_ * fVar75 + auVar58._0_4_ * fVar68;
      auVar89._4_4_ = local_fa8._4_4_ * fVar76 + auVar59._4_4_ * fVar75 + auVar58._4_4_ * fVar68;
      auVar89._8_4_ = local_fa8._8_4_ * fVar76 + auVar59._8_4_ * fVar75 + auVar58._8_4_ * fVar68;
      auVar89._12_4_ = local_fa8._12_4_ * fVar76 + auVar59._12_4_ * fVar75 + auVar58._12_4_ * fVar68
      ;
      local_1108 = auVar51._0_4_;
      fStack_1104 = auVar51._4_4_;
      fStack_1100 = auVar51._8_4_;
      fStack_10fc = auVar51._12_4_;
      auVar82._8_4_ = 0x80000000;
      auVar82._0_8_ = 0x8000000080000000;
      auVar82._12_4_ = 0x80000000;
      auVar52 = vandps_avx(auVar89,auVar82);
      uVar43 = auVar52._0_4_;
      local_1038._0_4_ =
           (float)(uVar43 ^ (uint)(local_1108 * fVar24 +
                                  auVar60._0_4_ * fVar16 + auVar69._0_4_ * fVar8));
      uVar100 = auVar52._4_4_;
      local_1038._4_4_ =
           (float)(uVar100 ^
                  (uint)(fStack_1104 * fVar25 + auVar60._4_4_ * fVar17 + auVar69._4_4_ * fVar9));
      uVar101 = auVar52._8_4_;
      local_1038._8_4_ =
           (float)(uVar101 ^
                  (uint)(fStack_1100 * fVar26 + auVar60._8_4_ * fVar18 + auVar69._8_4_ * fVar10));
      uVar102 = auVar52._12_4_;
      local_1038._12_4_ =
           (float)(uVar102 ^
                  (uint)(fStack_10fc * fVar27 + auVar60._12_4_ * fVar19 + auVar69._12_4_ * fVar11));
      local_1028._0_4_ =
           (float)(uVar43 ^ (uint)(auVar69._0_4_ * fVar20 + auVar60._0_4_ * fVar12 +
                                  local_1108 * fVar28));
      local_1028._4_4_ =
           (float)(uVar100 ^
                  (uint)(auVar69._4_4_ * fVar21 + auVar60._4_4_ * fVar13 + fStack_1104 * fVar29));
      local_1028._8_4_ =
           (float)(uVar101 ^
                  (uint)(auVar69._8_4_ * fVar22 + auVar60._8_4_ * fVar14 + fStack_1100 * fVar30));
      local_1028._12_4_ =
           (float)(uVar102 ^
                  (uint)(auVar69._12_4_ * fVar23 + auVar60._12_4_ * fVar15 + fStack_10fc * fVar31));
      auVar60 = ZEXT416(0) << 0x20;
      auVar52 = vcmpps_avx(local_1038,auVar60,5);
      auVar51 = vcmpps_avx(local_1028,auVar60,5);
      auVar52 = vandps_avx(auVar52,auVar51);
      auVar72._8_4_ = 0x7fffffff;
      auVar72._0_8_ = 0x7fffffff7fffffff;
      auVar72._12_4_ = 0x7fffffff;
      local_1008 = vandps_avx(auVar89,auVar72);
      auVar51 = vcmpps_avx(auVar89,auVar60,4);
      auVar52 = vandps_avx(auVar52,auVar51);
      auVar65._0_4_ = local_1038._0_4_ + local_1028._0_4_;
      auVar65._4_4_ = local_1038._4_4_ + local_1028._4_4_;
      auVar65._8_4_ = local_1038._8_4_ + local_1028._8_4_;
      auVar65._12_4_ = local_1038._12_4_ + local_1028._12_4_;
      auVar51 = vcmpps_avx(auVar65,local_1008,2);
      auVar60 = auVar51 & auVar52;
      if ((((auVar60 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar60 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar60 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar60[0xf] < '\0'
         ) {
        auVar52 = vandps_avx(auVar52,auVar51);
        local_1018._0_4_ =
             (float)(uVar43 ^ (uint)(local_fa8._0_4_ * fVar90 +
                                    fVar78 * auVar58._0_4_ + fVar79 * auVar59._0_4_));
        local_1018._4_4_ =
             (float)(uVar100 ^
                    (uint)(local_fa8._4_4_ * fVar94 +
                          fVar77 * auVar58._4_4_ + fVar83 * auVar59._4_4_));
        local_1018._8_4_ =
             (float)(uVar101 ^
                    (uint)(local_fa8._8_4_ * fVar95 + fVar6 * auVar58._8_4_ + fVar84 * auVar59._8_4_
                          ));
        local_1018._12_4_ =
             (float)(uVar102 ^
                    (uint)(local_fa8._12_4_ * fVar96 +
                          fVar7 * auVar58._12_4_ + fVar85 * auVar59._12_4_));
        fVar68 = *(float *)(ray + k * 4 + 0x30);
        fVar75 = local_1008._0_4_;
        auVar66._0_4_ = fVar75 * fVar68;
        fVar76 = local_1008._4_4_;
        auVar66._4_4_ = fVar76 * fVar68;
        fVar78 = local_1008._8_4_;
        auVar66._8_4_ = fVar78 * fVar68;
        fVar77 = local_1008._12_4_;
        auVar66._12_4_ = fVar77 * fVar68;
        auVar51 = vcmpps_avx(auVar66,local_1018,1);
        fVar68 = *(float *)(ray + k * 4 + 0x80);
        auVar98._0_4_ = fVar75 * fVar68;
        auVar98._4_4_ = fVar76 * fVar68;
        auVar98._8_4_ = fVar78 * fVar68;
        auVar98._12_4_ = fVar77 * fVar68;
        auVar60 = vcmpps_avx(local_1018,auVar98,2);
        auVar51 = vandps_avx(auVar51,auVar60);
        auVar60 = auVar52 & auVar51;
        if ((((auVar60 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar60 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar60 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar60[0xf] < '\0') {
          local_10a8[0] = vandps_avx(auVar51,auVar52);
          local_fe8 = local_10a8[0];
          local_10b8 = auVar58._0_8_;
          uStack_10b0 = auVar58._8_8_;
          local_f98 = local_10b8;
          uStack_f90 = uStack_10b0;
          local_10c8 = auVar59._0_8_;
          uStack_10c0 = auVar59._8_8_;
          local_f88 = local_10c8;
          uStack_f80 = uStack_10c0;
          auVar52 = vrcpps_avx(local_1008);
          fVar68 = auVar52._0_4_;
          auVar73._0_4_ = fVar75 * fVar68;
          fVar75 = auVar52._4_4_;
          auVar73._4_4_ = fVar76 * fVar75;
          fVar76 = auVar52._8_4_;
          auVar73._8_4_ = fVar78 * fVar76;
          fVar78 = auVar52._12_4_;
          auVar73._12_4_ = fVar77 * fVar78;
          auVar99._8_4_ = 0x3f800000;
          auVar99._0_8_ = 0x3f8000003f800000;
          auVar99._12_4_ = 0x3f800000;
          auVar52 = vsubps_avx(auVar99,auVar73);
          fVar68 = fVar68 + fVar68 * auVar52._0_4_;
          fVar75 = fVar75 + fVar75 * auVar52._4_4_;
          fVar76 = fVar76 + fVar76 * auVar52._8_4_;
          fVar78 = fVar78 + fVar78 * auVar52._12_4_;
          auVar92._0_4_ = fVar68 * local_1018._0_4_;
          auVar92._4_4_ = fVar75 * local_1018._4_4_;
          auVar92._8_4_ = fVar76 * local_1018._8_4_;
          auVar92._12_4_ = fVar78 * local_1018._12_4_;
          local_fb8 = auVar92;
          local_fd8[0] = fVar68 * local_1038._0_4_;
          local_fd8[1] = fVar75 * local_1038._4_4_;
          local_fd8[2] = fVar76 * local_1038._8_4_;
          local_fd8[3] = fVar78 * local_1038._12_4_;
          auVar74._8_4_ = 0x7f800000;
          auVar74._0_8_ = 0x7f8000007f800000;
          auVar74._12_4_ = 0x7f800000;
          auVar52 = vblendvps_avx(auVar74,auVar92,local_10a8[0]);
          local_fc8[0] = fVar68 * local_1028._0_4_;
          local_fc8[1] = fVar75 * local_1028._4_4_;
          local_fc8[2] = fVar76 * local_1028._8_4_;
          local_fc8[3] = fVar78 * local_1028._12_4_;
          auVar51 = vshufps_avx(auVar52,auVar52,0xb1);
          auVar51 = vminps_avx(auVar51,auVar52);
          auVar58 = vshufpd_avx(auVar51,auVar51,1);
          auVar51 = vminps_avx(auVar58,auVar51);
          auVar52 = vcmpps_avx(auVar52,auVar51,0);
          auVar58 = local_10a8[0] & auVar52;
          auVar51 = vpcmpeqd_avx(auVar51,auVar51);
          if ((((auVar58 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar58 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar58 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar58[0xf] < '\0') {
            auVar51 = auVar52;
          }
          auVar52 = vandps_avx(local_10a8[0],auVar51);
          uVar35 = vmovmskps_avx(auVar52);
          uVar36 = CONCAT44((int)((ulong)context->scene >> 0x20),uVar35);
          lVar44 = 0;
          if (uVar36 != 0) {
            for (; (uVar36 >> lVar44 & 1) == 0; lVar44 = lVar44 + 1) {
            }
          }
          pRVar5 = (context->scene->geometries).items;
          uVar43 = *(uint *)(ray + k * 4 + 0x90);
          while (uVar100 = *(uint *)(lVar39 + uVar46 + 0x90 + lVar44 * 4),
                ((pRVar5[uVar100].ptr)->mask & uVar43) == 0) {
            *(undefined4 *)(local_10a8[0] + lVar44 * 4) = 0;
            if ((((local_10a8[0] >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (local_10a8[0] >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (local_10a8[0] >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < local_10a8[0][0xf]) goto LAB_00edcc04;
            auVar67._8_4_ = 0x7f800000;
            auVar67._0_8_ = 0x7f8000007f800000;
            auVar67._12_4_ = 0x7f800000;
            auVar52 = vblendvps_avx(auVar67,auVar92,local_10a8[0]);
            auVar51 = vshufps_avx(auVar52,auVar52,0xb1);
            auVar51 = vminps_avx(auVar51,auVar52);
            auVar58 = vshufpd_avx(auVar51,auVar51,1);
            auVar51 = vminps_avx(auVar58,auVar51);
            auVar51 = vcmpps_avx(auVar52,auVar51,0);
            auVar58 = local_10a8[0] & auVar51;
            auVar52 = local_10a8[0];
            if ((((auVar58 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar58 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar58 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar58[0xf] < '\0') {
              auVar52 = vandps_avx(auVar51,local_10a8[0]);
            }
            uVar35 = vmovmskps_avx(auVar52);
            uVar36 = CONCAT44((int)((ulong)lVar44 >> 0x20),uVar35);
            lVar44 = 0;
            if (uVar36 != 0) {
              for (; (uVar36 >> lVar44 & 1) == 0; lVar44 = lVar44 + 1) {
              }
            }
          }
          fVar68 = local_fd8[lVar44];
          fVar75 = local_fc8[lVar44];
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_fb8 + lVar44 * 4);
          *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_fa8 + lVar44 * 4);
          *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)((long)&local_f98 + lVar44 * 4);
          *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)&local_f88 + lVar44 * 4);
          *(float *)(ray + k * 4 + 0xf0) = fVar68;
          *(float *)(ray + k * 4 + 0x100) = fVar75;
          *(undefined4 *)(ray + k * 4 + 0x110) =
               *(undefined4 *)(lVar39 + uVar46 + 0xa0 + lVar44 * 4);
          *(uint *)(ray + k * 4 + 0x120) = uVar100;
          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
          *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
        }
      }
LAB_00edcc04:
    }
    uVar35 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar93 = ZEXT1664(CONCAT412(uVar35,CONCAT48(uVar35,CONCAT44(uVar35,uVar35))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }